

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  float fVar1;
  ImS8 IVar2;
  
  if (cond != 0) {
    if ((window->SetWindowSizeAllowFlags & cond) == 0) {
      return;
    }
    if ((cond & cond - 1U) != 0) {
      __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x192d,"void ImGui::SetWindowSize(ImGuiWindow *, const ImVec2 &, ImGuiCond)");
    }
  }
  window->SetWindowSizeAllowFlags = window->SetWindowSizeAllowFlags & 0xfffffff1;
  if (size->x <= 0.0) {
    window->AutoFitOnlyGrows = false;
    IVar2 = '\x02';
  }
  else {
    (window->SizeFull).x = (float)(int)size->x;
    IVar2 = '\0';
  }
  window->AutoFitFramesX = IVar2;
  fVar1 = size->y;
  if (fVar1 <= 0.0) {
    window->AutoFitFramesY = '\x02';
    window->AutoFitOnlyGrows = false;
    return;
  }
  window->AutoFitFramesY = '\0';
  (window->SizeFull).y = (float)(int)fVar1;
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = IM_FLOOR(size.x);
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = IM_FLOOR(size.y);
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}